

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysql.hpp
# Opt level: O0

int __thiscall shine::db::mysql::open(mysql *this,char *__file,int __oflag,...)

{
  uint16 uVar1;
  mysql_close_t p_Var2;
  mysql_error_t p_Var3;
  mysql_set_character_set_t p_Var4;
  mysql_real_connect_t p_Var5;
  mysql_options_t p_Var6;
  mysql_autocommit_t p_Var7;
  bool bVar8;
  my_bool mVar9;
  int iVar10;
  MYSQL_t *ppMVar11;
  MYSQL *pMVar12;
  mysql_connect_info *pmVar13;
  string *addr_00;
  uint32 *puVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  uint16 *puVar18;
  uLong *puVar19;
  ulong uVar20;
  undefined8 uVar21;
  bool *pbVar22;
  MYSQL_t *extraout_RAX;
  char *local_150;
  char *local_100;
  undefined1 local_5d [8];
  my_bool reconnect;
  byte local_49;
  undefined1 local_48 [7];
  bool unix_socket;
  address_info_t addr;
  mysql *this_local;
  
  addr._32_8_ = this;
  ppMVar11 = get_conn(this);
  if (*ppMVar11 == (MYSQL_t)0x0) {
    ppMVar11 = get_conn(this);
    if (*ppMVar11 == (MYSQL_t)0x0) {
      pMVar12 = (*mysql_init_func)((MYSQL *)0x0);
      ppMVar11 = get_conn(this);
      *ppMVar11 = pMVar12;
      ppMVar11 = get_conn(this);
      if (*ppMVar11 == (MYSQL_t)0x0) {
        this_local._7_1_ = 0;
        goto LAB_001b5a1b;
      }
    }
    net::address_info_t::address_info_t((address_info_t *)local_48);
    pmVar13 = get_connect_info(this);
    addr_00 = mysql_connect_info::get_addr(pmVar13);
    bVar8 = net::socket::parse_addr(addr_00,(address_info_t *)local_48);
    local_49 = ~bVar8 & 1;
    pmVar13 = get_connect_info(this);
    puVar14 = mysql_connect_info::get_conn_timeout(pmVar13);
    p_Var6 = mysql_options_func;
    if (*puVar14 != 0) {
      ppMVar11 = get_conn(this);
      pMVar12 = *ppMVar11;
      pmVar13 = get_connect_info(this);
      puVar14 = mysql_connect_info::get_conn_timeout(pmVar13);
      (*p_Var6)(pMVar12,MYSQL_OPT_CONNECT_TIMEOUT,puVar14);
    }
    pmVar13 = get_connect_info(this);
    puVar14 = mysql_connect_info::get_rw_timeout(pmVar13);
    p_Var6 = mysql_options_func;
    if (*puVar14 != 0) {
      ppMVar11 = get_conn(this);
      pMVar12 = *ppMVar11;
      pmVar13 = get_connect_info(this);
      puVar14 = mysql_connect_info::get_rw_timeout(pmVar13);
      (*p_Var6)(pMVar12,MYSQL_OPT_READ_TIMEOUT,puVar14);
      p_Var6 = mysql_options_func;
      ppMVar11 = get_conn(this);
      pMVar12 = *ppMVar11;
      pmVar13 = get_connect_info(this);
      puVar14 = mysql_connect_info::get_rw_timeout(pmVar13);
      (*p_Var6)(pMVar12,MYSQL_OPT_WRITE_TIMEOUT,puVar14);
    }
    p_Var6 = mysql_options_func;
    local_5d[0] = 1;
    ppMVar11 = get_conn(this);
    (*p_Var6)(*ppMVar11,MYSQL_OPT_RECONNECT,local_5d);
    p_Var5 = mysql_real_connect_func;
    ppMVar11 = get_conn(this);
    pMVar12 = *ppMVar11;
    if ((local_49 & 1) == 0) {
      net::address_info_t::get_ip((address_info_t *)local_48);
      local_100 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_100 = (char *)0x0;
    }
    pmVar13 = get_connect_info(this);
    mysql_connect_info::get_user(pmVar13);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    pmVar13 = get_connect_info(this);
    mysql_connect_info::get_password(pmVar13);
    pcVar16 = (char *)std::__cxx11::string::c_str();
    pmVar13 = get_connect_info(this);
    mysql_connect_info::get_database(pmVar13);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    if ((local_49 & 1) == 0) {
      puVar18 = net::address_info_t::get_port((address_info_t *)local_48);
      uVar1 = *puVar18;
    }
    else {
      uVar1 = 0;
    }
    if ((local_49 & 1) == 0) {
      local_150 = (char *)0x0;
    }
    else {
      pmVar13 = get_connect_info(this);
      mysql_connect_info::get_addr(pmVar13);
      local_150 = (char *)std::__cxx11::string::c_str();
    }
    pmVar13 = get_connect_info(this);
    puVar19 = mysql_connect_info::get_flags(pmVar13);
    pMVar12 = (*p_Var5)(pMVar12,local_100,pcVar15,pcVar16,pcVar17,(uint)uVar1,local_150,*puVar19);
    p_Var2 = mysql_close_func;
    if (pMVar12 == (MYSQL *)0x0) {
      ppMVar11 = get_conn(this);
      (*p_Var2)(*ppMVar11);
      ppMVar11 = get_conn(this);
      *ppMVar11 = (MYSQL_t)0x0;
      this_local._7_1_ = 0;
    }
    else {
      pmVar13 = get_connect_info(this);
      mysql_connect_info::get_charset(pmVar13);
      uVar20 = std::__cxx11::string::empty();
      p_Var4 = mysql_set_character_set_func;
      if ((uVar20 & 1) == 0) {
        ppMVar11 = get_conn(this);
        pMVar12 = *ppMVar11;
        pmVar13 = get_connect_info(this);
        mysql_connect_info::get_charset(pmVar13);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        iVar10 = (*p_Var4)(pMVar12,pcVar15);
        if (iVar10 != 0) {
          pmVar13 = get_connect_info(this);
          mysql_connect_info::get_charset(pmVar13);
          uVar21 = std::__cxx11::string::c_str();
          p_Var3 = mysql_error_func;
          ppMVar11 = get_conn(this);
          pcVar15 = (*p_Var3)(*ppMVar11);
          printf("set mysql to %s error %s",uVar21,pcVar15);
        }
      }
      p_Var7 = mysql_autocommit_func;
      ppMVar11 = get_conn(this);
      pMVar12 = *ppMVar11;
      pmVar13 = get_connect_info(this);
      pbVar22 = mysql_connect_info::get_auto_commit(pmVar13);
      mVar9 = (*p_Var7)(pMVar12,*pbVar22 & 1);
      p_Var2 = mysql_close_func;
      if (mVar9 == '\0') {
        this_local._7_1_ = 1;
      }
      else {
        ppMVar11 = get_conn(this);
        (*p_Var2)(*ppMVar11);
        ppMVar11 = get_conn(this);
        *ppMVar11 = (MYSQL_t)0x0;
        this_local._7_1_ = 0;
      }
    }
    net::address_info_t::~address_info_t((address_info_t *)local_48);
    ppMVar11 = extraout_RAX;
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_001b5a1b:
  return (int)CONCAT71((int7)((ulong)ppMVar11 >> 8),this_local._7_1_);
}

Assistant:

bool open() {
                if (get_conn() != NULL)
                    return true;

                if (get_conn() == NULL) {
                    get_conn() = mysql_init_func(NULL);
                    if (get_conn() == NULL)
                        return false;
                }

                net::address_info_t addr;
                bool unix_socket = !net::socket::parse_addr(get_connect_info().get_addr(), addr);

                if (get_connect_info().get_conn_timeout() > 0)
                    mysql_options_func(get_conn(), MYSQL_OPT_CONNECT_TIMEOUT,
                                       (const void *) &get_connect_info().get_conn_timeout());

                if (get_connect_info().get_rw_timeout() > 0) {
                    mysql_options_func(get_conn(), MYSQL_OPT_READ_TIMEOUT,
                                       (const void *) &get_connect_info().get_rw_timeout());
                    mysql_options_func(get_conn(), MYSQL_OPT_WRITE_TIMEOUT,
                                       (const void *) &get_connect_info().get_rw_timeout());
                }

                my_bool reconnect = 1;

                mysql_options_func(get_conn(), MYSQL_OPT_RECONNECT, (const void *) &reconnect);

                if (mysql_real_connect_func(get_conn(),
                                            unix_socket ? NULL : addr.get_ip().c_str(),
                                            get_connect_info().get_user().c_str(),
                                            get_connect_info().get_password().c_str(),
                                            get_connect_info().get_database().c_str(),
                                            unix_socket ? 0 : addr.get_port(),
                                            unix_socket ? get_connect_info().get_addr().c_str() : NULL,
                                            get_connect_info().get_flags()) == NULL) {
                    mysql_close_func(get_conn());
                    get_conn() = NULL;
                    return false;
                }

                if (!get_connect_info().get_charset().empty()) {
                    if (mysql_set_character_set_func(get_conn(), get_connect_info().get_charset().c_str()))
                        printf("set mysql to %s error %s", get_connect_info().get_charset().c_str(),
                               mysql_error_func(get_conn()));
                }

#if MYSQL_VERSION_ID >= 50000
                if (mysql_autocommit_func(get_conn(), get_connect_info().get_auto_commit() ? 1 : 0) != 0) {
                    mysql_close_func(get_conn());
                    get_conn() = NULL;
                    return (false);
                }
#else
                get_connect_info().get_auto_commit() = false;
#endif

                return true;
            }